

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

KeyData * __thiscall
cfd::core::HDWallet::GeneratePubkeyData
          (KeyData *__return_storage_ptr__,HDWallet *this,NetType network_type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path)

{
  ExtPrivkey *this_00;
  KeyData *this_01;
  ExtPubkey local_1e8;
  Privkey local_178;
  Pubkey local_158;
  undefined1 local_140 [8];
  ByteData fingerprint;
  undefined1 local_118 [8];
  ExtPrivkey key;
  ExtPrivkey privkey;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *path_local;
  NetType network_type_local;
  HDWallet *this_local;
  
  this_00 = (ExtPrivkey *)
            &key.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  this_01 = __return_storage_ptr__;
  ExtPrivkey::ExtPrivkey(this_00,&this->seed_,network_type);
  ExtPrivkey::DerivePrivkey((ExtPrivkey *)local_118,this_00,path);
  ExtPrivkey::GetPrivkey
            (&local_178,
             (ExtPrivkey *)
             &key.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Privkey::GeneratePubkey(&local_158,&local_178,true);
  Pubkey::GetFingerprint((ByteData *)local_140,&local_158,4);
  Pubkey::~Pubkey((Pubkey *)0x4422a3);
  Privkey::~Privkey((Privkey *)0x4422af);
  ExtPrivkey::GetExtPubkey(&local_1e8,(ExtPrivkey *)local_118);
  KeyData::KeyData(this_01,&local_1e8,path,(ByteData *)local_140);
  ExtPubkey::~ExtPubkey((ExtPubkey *)this_01);
  ByteData::~ByteData((ByteData *)0x4422fc);
  ExtPrivkey::~ExtPrivkey((ExtPrivkey *)this_01);
  ExtPrivkey::~ExtPrivkey((ExtPrivkey *)this_01);
  return __return_storage_ptr__;
}

Assistant:

KeyData HDWallet::GeneratePubkeyData(
    NetType network_type, const std::vector<uint32_t>& path) const {
  ExtPrivkey privkey(seed_, network_type);
  ExtPrivkey key = privkey.DerivePrivkey(path);
  auto fingerprint = privkey.GetPrivkey().GeneratePubkey().GetFingerprint();
  return KeyData(key.GetExtPubkey(), path, fingerprint);
}